

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

Var BranchBailOutRecord::BailOutInlined
              (JavascriptCallStackLayout *layout,BranchBailOutRecord *bailOutRecord,BOOL cond,
              void *returnAddress,ImplicitCallFlags savedImplicitCallFlags)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *this;
  JavascriptLibrary *pJVar4;
  Var pvVar5;
  ScriptContext *local_50;
  uint32 local_44;
  ScriptContext *scriptContext;
  Var branchValue;
  uint32 bailOutOffset;
  ImplicitCallFlags savedImplicitCallFlags_local;
  void *returnAddress_local;
  BOOL cond_local;
  BranchBailOutRecord *bailOutRecord_local;
  JavascriptCallStackLayout *layout_local;
  
  if ((bailOutRecord->super_BailOutRecord).parent == (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0xb7f,"(bailOutRecord->parent != nullptr)",
                       "bailOutRecord->parent != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (cond == 0) {
    local_44 = bailOutRecord->falseBailOutOffset;
  }
  else {
    local_44 = (bailOutRecord->super_BailOutRecord).bailOutOffset;
  }
  scriptContext = (ScriptContext *)0x0;
  if ((bailOutRecord->super_BailOutRecord).branchValueRegSlot != 0xffffffff) {
    this = Js::RecyclableObject::GetScriptContext(*(RecyclableObject **)layout);
    if (cond == 0) {
      pJVar4 = Js::ScriptContext::GetLibrary(this);
      local_50 = (ScriptContext *)
                 Js::JavascriptLibraryBase::GetFalse(&pJVar4->super_JavascriptLibraryBase);
    }
    else {
      pJVar4 = Js::ScriptContext::GetLibrary(this);
      local_50 = (ScriptContext *)
                 Js::JavascriptLibraryBase::GetTrue(&pJVar4->super_JavascriptLibraryBase);
    }
    scriptContext = local_50;
  }
  pvVar5 = BailOutRecord::BailOutInlinedCommon
                     (layout,&bailOutRecord->super_BailOutRecord,local_44,returnAddress,
                      (bailOutRecord->super_BailOutRecord).bailOutKind,savedImplicitCallFlags,
                      scriptContext);
  return pvVar5;
}

Assistant:

Js::Var
BranchBailOutRecord::BailOutInlined(Js::JavascriptCallStackLayout * layout, BranchBailOutRecord const * bailOutRecord, BOOL cond, void * returnAddress, Js::ImplicitCallFlags savedImplicitCallFlags)
{
    Assert(bailOutRecord->parent != nullptr);
    uint32 bailOutOffset = cond? bailOutRecord->bailOutOffset : bailOutRecord->falseBailOutOffset;
    Js::Var branchValue = nullptr;
    if (bailOutRecord->branchValueRegSlot != Js::Constants::NoRegister)
    {
        Js::ScriptContext *scriptContext = layout->functionObject->GetScriptContext();
        branchValue = (cond ? scriptContext->GetLibrary()->GetTrue() : scriptContext->GetLibrary()->GetFalse());
    }
    return __super::BailOutInlinedCommon(layout, bailOutRecord, bailOutOffset, returnAddress, bailOutRecord->bailOutKind, savedImplicitCallFlags, branchValue);
}